

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMocker<std::error_code_(bool)>::Invoke
          (FunctionMocker<std::error_code_(bool)> *this,bool args)

{
  uint uVar1;
  error_category *peVar2;
  UntypedActionResultHolderBase *pUVar3;
  long lVar4;
  bool bVar5;
  Result RVar6;
  ArgumentTuple tuple;
  undefined1 local_1d;
  GTestLog local_1c;
  
  local_1d = args;
  pUVar3 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&local_1d);
  if (pUVar3 == (UntypedActionResultHolderBase *)0x0) {
    bVar5 = true;
  }
  else {
    lVar4 = __dynamic_cast(pUVar3,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<std::error_code>::typeinfo,0);
    bVar5 = lVar4 != 0;
  }
  bVar5 = IsTrue(bVar5);
  if (!bVar5) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x454);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog(&local_1c);
  }
  uVar1 = *(uint *)&pUVar3[1]._vptr_UntypedActionResultHolderBase;
  peVar2 = (error_category *)pUVar3[2]._vptr_UntypedActionResultHolderBase;
  (*pUVar3->_vptr_UntypedActionResultHolderBase[1])(pUVar3);
  RVar6._4_4_ = 0;
  RVar6._M_value = uVar1;
  RVar6._M_cat = peVar2;
  return RVar6;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }